

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

void __thiscall Parser::printError(Parser *this,Token *token,string *text)

{
  size_t sVar1;
  string_view text_00;
  
  sVar1 = token->line;
  this->errorLine = sVar1;
  Global.FileInfo.LineNumber = (int)sVar1;
  text_00._M_str = (char *)&Global;
  text_00._M_len = (size_t)(text->_M_dataplus)._M_p;
  Logger::printError((Logger *)0x1,(ErrorType)text->_M_string_length,text_00);
  this->error = true;
  return;
}

Assistant:

void Parser::printError(const Token &token, const std::string &text)
{
	errorLine = token.line;
	Global.FileInfo.LineNumber = (int) token.line;
	Logger::printError(Logger::Error, text);
	error = true;
}